

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O0

void __thiscall
MemoryAccountant::createCacheSizeNodes(MemoryAccountant *this,size_t *sizes,size_t length)

{
  MemoryAccountantAllocationNode *pMVar1;
  MemoryAccountantAllocationNode *local_30;
  MemoryAccountantAllocationNode *lastNode;
  size_t i;
  size_t length_local;
  size_t *sizes_local;
  MemoryAccountant *this_local;
  
  for (lastNode = (MemoryAccountantAllocationNode *)0x0; lastNode < length;
      lastNode = (MemoryAccountantAllocationNode *)((long)&lastNode->size_ + 1)) {
    findOrCreateNodeOfSize(this,sizes[(long)lastNode]);
  }
  if (this->head_ == (MemoryAccountantAllocationNode *)0x0) {
    pMVar1 = createNewAccountantAllocationNode(this,0,(MemoryAccountantAllocationNode *)0x0);
    this->head_ = pMVar1;
  }
  else {
    for (local_30 = this->head_; local_30 != (MemoryAccountantAllocationNode *)0x0;
        local_30 = local_30->next_) {
      if (local_30->next_ == (MemoryAccountantAllocationNode *)0x0) {
        pMVar1 = createNewAccountantAllocationNode(this,0,(MemoryAccountantAllocationNode *)0x0);
        local_30->next_ = pMVar1;
        return;
      }
    }
  }
  return;
}

Assistant:

void MemoryAccountant::createCacheSizeNodes(size_t sizes[], size_t length)
{
    for (size_t i = 0; i < length; i++)
        findOrCreateNodeOfSize(sizes[i]);

    if (head_ == NULLPTR)
        head_ = createNewAccountantAllocationNode(0, NULLPTR);
    else {
        for (MemoryAccountantAllocationNode* lastNode = head_; lastNode; lastNode = lastNode->next_) {
            if (lastNode->next_ == NULLPTR) {
                lastNode->next_ = createNewAccountantAllocationNode(0, NULLPTR);
                break;
            }
        }
    }
}